

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QHttpPartPrivate>::detach_helper(QSharedDataPointer<QHttpPartPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QHttpPartPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QHttpPartPrivate> *in_RDI;
  void *in_R8;
  QHttpPartPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2e6a4b);
  Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2e6a5d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::get(&in_RDI->d),
     this_00 != (QHttpPartPrivate *)0x0)) {
    QHttpPartPrivate::~QHttpPartPrivate(this_00);
    operator_delete(this_00,0x98);
  }
  Qt::totally_ordered_wrapper<QHttpPartPrivate_*>::reset
            (&in_RDI->d,(QHttpPartPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}